

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall foxxll::config::load_default_config(config *this)

{
  disk_config entry1;
  string sStack_1c8;
  string local_1a8;
  Logger local_188;
  
  tlx::Logger::Logger(&local_188);
  std::operator<<((ostream *)&local_188,"foxxll: [Warning] no config file found.");
  tlx::Logger::~Logger(&local_188);
  tlx::Logger::Logger(&local_188);
  std::operator<<((ostream *)&local_188,"foxxll: Using default disk configuration.");
  tlx::Logger::~Logger(&local_188);
  (*this->_vptr_config[6])(&local_1a8,this);
  (*this->_vptr_config[7])(&sStack_1c8,this);
  disk_config::disk_config((disk_config *)&local_188,&local_1a8,0x3e800000,&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  local_188._72_2_ = 0x101;
  add_disk(this,(disk_config *)&local_188);
  disk_config::~disk_config((disk_config *)&local_188);
  return;
}

Assistant:

void config::load_default_config()
{
    TLX_LOG1 << "foxxll: [Warning] no config file found.";
    TLX_LOG1 << "foxxll: Using default disk configuration.";
    disk_config entry1(default_disk_path(), 1000 * 1024 * 1024,
                       default_disk_io_impl());
    entry1.delete_on_exit = true;
    entry1.autogrow = true;
    add_disk(entry1);
}